

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O0

Swp_Man_t * Swp_ManStart(Gia_Man_t *pGia)

{
  int Var;
  Swp_Man_t *p_00;
  Vec_Int_t *pVVar1;
  sat_solver *psVar2;
  abctime aVar3;
  int local_1c;
  Swp_Man_t *pSStack_18;
  int Lit;
  Swp_Man_t *p;
  Gia_Man_t *pGia_local;
  
  p = (Swp_Man_t *)pGia;
  if (pGia->pHTable != (int *)0x0) {
    pSStack_18 = (Swp_Man_t *)calloc(1,0xa8);
    p[3].vFront = (Vec_Int_t *)pSStack_18;
    pSStack_18->pGia = (Gia_Man_t *)p;
    pSStack_18->nConfMax = 1000;
    pVVar1 = Vec_IntAlloc(100);
    pSStack_18->vProbes = pVVar1;
    pVVar1 = Vec_IntAlloc(100);
    pSStack_18->vCondProbes = pVVar1;
    pVVar1 = Vec_IntAlloc(100);
    pSStack_18->vCondAssump = pVVar1;
    pVVar1 = Vec_IntAlloc(10000);
    pSStack_18->vId2Lit = pVVar1;
    pVVar1 = Vec_IntAlloc(100);
    pSStack_18->vFront = pVVar1;
    pVVar1 = Vec_IntAlloc(100);
    pSStack_18->vFanins = pVVar1;
    pVVar1 = Vec_IntAlloc(100);
    pSStack_18->vCexSwp = pVVar1;
    psVar2 = sat_solver_new();
    pSStack_18->pSat = psVar2;
    pSStack_18->nSatVars = 1;
    sat_solver_setnvars(pSStack_18->pSat,1000);
    p_00 = pSStack_18;
    Var = pSStack_18->nSatVars;
    pSStack_18->nSatVars = Var + 1;
    local_1c = Abc_Var2Lit(Var,0);
    Swp_ManSetObj2Lit(p_00,0,local_1c);
    local_1c = Abc_LitNot(local_1c);
    sat_solver_addclause(pSStack_18->pSat,&local_1c,(lit *)&stack0xffffffffffffffe8);
    aVar3 = Abc_Clock();
    pSStack_18->timeStart = aVar3;
    return pSStack_18;
  }
  __assert_fail("pGia->pHTable != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweeper.c"
                ,0x6f,"Swp_Man_t *Swp_ManStart(Gia_Man_t *)");
}

Assistant:

static inline Swp_Man_t * Swp_ManStart( Gia_Man_t * pGia )
{
    Swp_Man_t * p;
    int Lit;
    assert( pGia->pHTable != NULL );
    pGia->pData = p = ABC_CALLOC( Swp_Man_t, 1 );
    p->pGia         = pGia;
    p->nConfMax     = 1000;
    p->vProbes      = Vec_IntAlloc( 100 );
    p->vCondProbes  = Vec_IntAlloc( 100 );
    p->vCondAssump  = Vec_IntAlloc( 100 );
    p->vId2Lit      = Vec_IntAlloc( 10000 );
    p->vFront       = Vec_IntAlloc( 100 );
    p->vFanins      = Vec_IntAlloc( 100 );
    p->vCexSwp      = Vec_IntAlloc( 100 );
    p->pSat         = sat_solver_new();
    p->nSatVars     = 1;
    sat_solver_setnvars( p->pSat, 1000 );
    Swp_ManSetObj2Lit( p, 0, (Lit = Abc_Var2Lit(p->nSatVars++, 0)) );
    Lit = Abc_LitNot(Lit);
    sat_solver_addclause( p->pSat, &Lit, &Lit + 1 );
    p->timeStart    = Abc_Clock();
    return p;
}